

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSFFile.cpp
# Opt level: O0

bool __thiscall PSFFile::save(PSFFile *this,string *filename)

{
  uint8_t version;
  bool bVar1;
  uchar *reserved;
  size_type sVar2;
  uint8_t *compressed_exe;
  size_t sVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  string *local_18;
  string *filename_local;
  PSFFile *this_local;
  
  version = this->version;
  local_18 = filename;
  filename_local = (string *)this;
  reserved = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->reserved);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->reserved);
  compressed_exe = ZlibReader::compressed_data(&this->compressed_exe);
  sVar3 = ZlibReader::compressed_size(&this->compressed_exe);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&local_48,&this->tags);
  bVar1 = save(filename,version,reserved,(uint32_t)sVar2,compressed_exe,(uint32_t)sVar3,&local_48);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_48);
  return bVar1;
}

Assistant:

bool PSFFile::save(const std::string& filename)
{
	return save(filename, version, reserved.data(), (uint32_t)reserved.size(), compressed_exe.compressed_data(), (uint32_t)compressed_exe.compressed_size(), tags);
}